

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddKmap.c
# Opt level: O2

void Extra_PrintKMap(FILE *Output,DdManager *dd,DdNode *OnSet,DdNode *OffSet,int nVars,
                    DdNode **XVars,int fSuppType,char **pVarNames)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *n;
  DdNode *n_00;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  DdNode **ppDVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  int local_80;
  
  uVar21 = (ulong)(uint)nVars;
  iVar3 = Cudd_bddLeq(dd,OnSet,(DdNode *)((ulong)OffSet ^ 1));
  if (iVar3 == 0) {
    fwrite("PrintKMap(): The on-set and the off-set overlap\n",0x30,1,(FILE *)Output);
    return;
  }
  if (nVars != 0) {
    printf("Truth table: ");
    if (nVars == 1) {
      printf("1-var function");
    }
    else {
      uVar4 = ~(-1 << ((char)nVars - 2U & 0x1f));
      iVar3 = uVar4 * 4;
      for (; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
        uVar6 = 0;
        for (iVar16 = 0; uVar19 = (uint)uVar6, iVar16 != 4; iVar16 = iVar16 + 1) {
          pDVar7 = Extra_bddBitsToCube(dd,iVar3 + iVar16,nVars,dd->vars,0);
          Cudd_Ref(pDVar7);
          pDVar8 = Cudd_Cofactor(dd,OnSet,pDVar7);
          Cudd_Ref(pDVar8);
          uVar6 = (ulong)(uVar19 | (uint)(pDVar8 == dd->one) << ((byte)iVar16 & 0x1f));
          Cudd_RecursiveDeref(dd,pDVar8);
          Cudd_RecursiveDeref(dd,pDVar7);
        }
        if ((int)uVar19 < 10) {
          fprintf(_stdout,"%d",uVar6);
        }
        else {
          fputc(uVar19 + 0x57,_stdout);
        }
        iVar3 = iVar3 + -4;
      }
    }
    putchar(10);
    if ((uint)nVars < 0x15) {
      if (XVars == (DdNode **)0x0) {
        if (fSuppType == 1) {
          ppDVar17 = s_XVars;
          for (uVar6 = 0; uVar21 != uVar6; uVar6 = uVar6 + 1) {
            pDVar7 = Cudd_bddIthVar(dd,dd->invperm[uVar6]);
            *ppDVar17 = pDVar7;
            ppDVar17 = ppDVar17 + 1;
          }
        }
        else if (fSuppType == 0) {
          ppDVar17 = s_XVars;
          for (uVar6 = 0; uVar21 != uVar6; uVar6 = uVar6 + 1) {
            pDVar7 = Cudd_bddIthVar(dd,(int)uVar6);
            *ppDVar17 = pDVar7;
            ppDVar17 = ppDVar17 + 1;
          }
        }
        else {
          pDVar8 = Cudd_Support(dd,OnSet);
          Cudd_Ref(pDVar8);
          pDVar9 = Cudd_Support(dd,OffSet);
          Cudd_Ref(pDVar9);
          pDVar7 = Cudd_bddAnd(dd,pDVar8,pDVar9);
          Cudd_Ref(pDVar7);
          Cudd_RecursiveDeref(dd,pDVar8);
          Cudd_RecursiveDeref(dd,pDVar9);
          nVars = Cudd_SupportSize(dd,pDVar7);
          if (0x14 < nVars) {
            fprintf((FILE *)Output,"PrintKMap(): The number of variables is more than %d\n",0x14);
            Cudd_RecursiveDeref(dd,pDVar7);
            return;
          }
          ppDVar17 = s_XVars;
          for (; pDVar7 != dd->one;
              pDVar7 = *(DdNode **)(((ulong)pDVar7 & 0xfffffffffffffffe) + 0x10)) {
            pDVar8 = Cudd_bddIthVar(dd,pDVar7->index);
            *ppDVar17 = pDVar8;
            ppDVar17 = ppDVar17 + 1;
          }
          Cudd_RecursiveDeref(dd,pDVar7);
        }
      }
      else {
        for (lVar12 = 0; uVar21 << 3 != lVar12; lVar12 = lVar12 + 8) {
          *(undefined8 *)((long)s_XVars + lVar12) = *(undefined8 *)((long)XVars + lVar12);
        }
      }
      uVar21 = (long)nVars / 2;
      iVar3 = (int)uVar21;
      uVar19 = nVars - iVar3;
      uVar4 = 1 << ((byte)uVar21 & 0x1f);
      fputc(10,(FILE *)Output);
      uVar6 = 0;
      if (0 < iVar3) {
        uVar6 = uVar21 & 0xffffffff;
      }
      for (uVar21 = 0; uVar6 != uVar21; uVar21 = uVar21 + 1) {
        if (pVarNames == (char **)0x0) {
          fputc(uVar19 + 0x61 + (int)uVar21,(FILE *)Output);
        }
        else {
          fprintf((FILE *)Output," %s",pVarNames[(long)(int)uVar19 + uVar21]);
        }
      }
      fwrite(" \\ ",3,1,(FILE *)Output);
      uVar21 = 0;
      if (0 < (int)uVar19) {
        uVar21 = (ulong)uVar19;
      }
      for (uVar18 = 0; uVar21 != uVar18; uVar18 = uVar18 + 1) {
        if (pVarNames == (char **)0x0) {
          fputc((int)uVar18 + 0x61,(FILE *)Output);
        }
        else {
          fprintf((FILE *)Output,"%s ",pVarNames[uVar18]);
        }
      }
      bVar1 = (byte)uVar19 & 0x1f;
      uVar13 = 1 << bVar1;
      fputc(10,(FILE *)Output);
      iVar16 = -3;
      if (-3 < iVar3) {
        iVar16 = iVar3;
      }
      iVar10 = 0;
      uVar5 = 0;
      if (0 < 1 << bVar1) {
        uVar5 = uVar13;
      }
      for (; local_80 = (int)uVar21, iVar14 = iVar16 + 3, iVar10 != local_80; iVar10 = iVar10 + 1) {
        while (bVar22 = iVar14 != 0, iVar14 = iVar14 + -1, bVar22) {
          fputc(0x20,(FILE *)Output);
        }
        for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
          pcVar2 = "On1   ";
          if (((uVar15 >> 1 ^ uVar15) & 1 << (~(byte)iVar10 + (byte)uVar19 & 0x1f)) == 0) {
            pcVar2 = "On0   ";
          }
          fwrite(pcVar2 + 2,4,1,(FILE *)Output);
        }
        fputc(10,(FILE *)Output);
      }
      iVar16 = -1;
      if (-1 < iVar3) {
        iVar16 = iVar3;
      }
      iVar16 = iVar16 + 1;
      iVar10 = iVar16;
      while (bVar22 = iVar10 != 0, iVar10 = iVar10 + -1, bVar22) {
        fputc(0x20,(FILE *)Output);
      }
      fputc(0x2b,(FILE *)Output);
      uVar13 = uVar13 - 1;
      for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
        fputc(0x2d,(FILE *)Output);
        fputc(0x2d,(FILE *)Output);
        fputc(0x2d,(FILE *)Output);
        if (uVar13 != uVar15) {
          fputc(0x2b,(FILE *)Output);
        }
      }
      fputc(0x2b,(FILE *)Output);
      fputc(10,(FILE *)Output);
      uVar15 = uVar4 - 1;
      uVar11 = 0;
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      do {
        if (uVar11 == uVar4) {
          while (bVar22 = iVar16 != 0, iVar16 = iVar16 + -1, bVar22) {
            fputc(0x20,(FILE *)Output);
          }
          fputc(0x2b,(FILE *)Output);
          for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
            fputc(0x2d,(FILE *)Output);
            fputc(0x2d,(FILE *)Output);
            fputc(0x2d,(FILE *)Output);
            if (uVar13 != uVar4) {
              fputc(0x2b,(FILE *)Output);
            }
          }
          fputc(0x2b,(FILE *)Output);
          fputc(10,(FILE *)Output);
          return;
        }
        uVar20 = uVar11 >> 1 ^ uVar11;
        for (iVar10 = -1; (int)uVar6 + iVar10 != -1; iVar10 = iVar10 + -1) {
          fputc(((uVar20 >> (iVar3 + iVar10 & 0x1fU) & 1) != 0) + 0x30,(FILE *)Output);
        }
        fputc(0x20,(FILE *)Output);
        pDVar7 = Extra_bddBitsToCube(dd,uVar20,iVar3,s_XVars + (int)uVar19,1);
        Cudd_Ref(pDVar7);
        fputc(0x7c,(FILE *)Output);
        for (uVar20 = 0; uVar5 != uVar20; uVar20 = uVar20 + 1) {
          fputc(0x20,(FILE *)Output);
          pDVar8 = Extra_bddBitsToCube(dd,uVar20 >> 1 ^ uVar20,uVar19,s_XVars,1);
          Cudd_Ref(pDVar8);
          pDVar9 = Cudd_bddAnd(dd,pDVar8,pDVar7);
          Cudd_Ref(pDVar9);
          Cudd_RecursiveDeref(dd,pDVar8);
          n = Cudd_Cofactor(dd,OnSet,pDVar9);
          Cudd_Ref(n);
          n_00 = Cudd_Cofactor(dd,OffSet,pDVar9);
          Cudd_Ref(n_00);
          Cudd_RecursiveDeref(dd,pDVar9);
          pDVar8 = dd->one;
          pDVar9 = (DdNode *)((ulong)pDVar8 ^ 1);
          if (((((n != pDVar8) || (iVar10 = 0x31, n_00 != pDVar9)) &&
               ((n_00 != pDVar8 || (iVar10 = 0x20, n != pDVar9)))) &&
              ((n != pDVar9 || (iVar10 = 0x2d, n_00 != pDVar9)))) &&
             ((n != pDVar8 || (iVar10 = 0x3f, n_00 != pDVar8)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddKmap.c"
                          ,0x1cc,
                          "void Extra_PrintKMap(FILE *, DdManager *, DdNode *, DdNode *, int, DdNode **, int, char **)"
                         );
          }
          fputc(iVar10,(FILE *)Output);
          Cudd_RecursiveDeref(dd,n);
          Cudd_RecursiveDeref(dd,n_00);
          fputc(0x20,(FILE *)Output);
          if (uVar13 != uVar20) {
            fputc(0x7c,(FILE *)Output);
          }
        }
        fputc(0x7c,(FILE *)Output);
        fputc(10,(FILE *)Output);
        Cudd_RecursiveDeref(dd,pDVar7);
        iVar10 = iVar16;
        if (uVar11 != uVar15) {
          while (iVar10 != 0) {
            fputc(0x20,(FILE *)Output);
            iVar10 = iVar10 + -1;
          }
          fputc(0x2b,(FILE *)Output);
          if ((uVar11 & 1) == 0) {
            for (uVar20 = 0; uVar5 != uVar20; uVar20 = uVar20 + 1) {
              fputc(0x2d,(FILE *)Output);
              fputc(0x2d,(FILE *)Output);
              fputc(0x2d,(FILE *)Output);
              if (uVar13 != uVar20) {
                fputc(0x2b,(FILE *)Output);
              }
            }
          }
          else {
            for (uVar20 = 0; uVar5 != uVar20; uVar20 = uVar20 + 1) {
              fputc(0x2d,(FILE *)Output);
              fputc(0x2d,(FILE *)Output);
              fputc(0x2d,(FILE *)Output);
              if (uVar13 != uVar20) {
                fputc(0x2b,(FILE *)Output);
              }
            }
          }
          fputc(0x2b,(FILE *)Output);
          fputc(10,(FILE *)Output);
        }
        uVar11 = uVar11 + 1;
      } while( true );
    }
    fprintf((FILE *)Output,
            "PrintKMap(): The number of variables is less than zero or more than %d\n",0x14);
    return;
  }
  printf("Function is constant %d.\n",(ulong)(~(uint)OnSet & 1));
  return;
}

Assistant:

void Extra_PrintKMap( 
  FILE * Output,  /* the output stream */
  DdManager * dd, 
  DdNode * OnSet, 
  DdNode * OffSet, 
  int nVars, 
  DdNode ** XVars, 
  int fSuppType, /* the flag which determines how support is computed */
  char ** pVarNames )
{
    int fPrintTruth = 1;
    int d, p, n, s, v, h, w;
    int nVarsVer;
    int nVarsHor;
    int nCellsVer;
    int nCellsHor;
    int nSkipSpaces;

    // make sure that on-set and off-set do not overlap
    if ( !Cudd_bddLeq( dd, OnSet, Cudd_Not(OffSet) ) )
    {
        fprintf( Output, "PrintKMap(): The on-set and the off-set overlap\n" );
        return;
    }
    if ( nVars == 0 )
        { printf( "Function is constant %d.\n", !Cudd_IsComplement(OnSet) ); return; }

    // print truth table for debugging
    if ( fPrintTruth )
    {
        DdNode * bCube, * bPart;
        printf( "Truth table: " );
        if ( nVars == 0 )
            printf( "Constant" );
        else if ( nVars == 1 )
            printf( "1-var function" );
        else
        {
//            printf( "0x" );
            for ( d = (1<<(nVars-2)) - 1; d >= 0; d-- )
            {
                int Value = 0;
                for ( s = 0; s < 4; s++ )
                {
                    bCube = Extra_bddBitsToCube( dd, 4*d+s, nVars, dd->vars, 0 );   Cudd_Ref( bCube );
                    bPart = Cudd_Cofactor( dd, OnSet, bCube );                      Cudd_Ref( bPart );
                    Value |= ((int)(bPart == b1) << s);
                    Cudd_RecursiveDeref( dd, bPart );
                    Cudd_RecursiveDeref( dd, bCube );
                }
                if ( Value < 10 )
                    fprintf( stdout, "%d", Value );
                else
                    fprintf( stdout, "%c", 'a' + Value-10 );
            }
        }
        printf( "\n" );
    }


/*
    if ( OnSet == b1 )
    {
        fprintf( Output, "PrintKMap(): Constant 1\n" );
        return;
    }
    if ( OffSet == b1 )
    {
        fprintf( Output, "PrintKMap(): Constant 0\n" );
        return;
    }
*/
    if ( nVars < 0 || nVars > MAXVARS )
    {
        fprintf( Output, "PrintKMap(): The number of variables is less than zero or more than %d\n", MAXVARS );
        return;
    }

    // determine the support if it is not given
    if ( XVars == NULL )
    {
        if ( fSuppType == 0 )
        {   // assume that the support includes the first nVars of the manager
            assert( nVars );
            for ( v = 0; v < nVars; v++ )
                s_XVars[v] = Cudd_bddIthVar( dd, v );
        }
        else if ( fSuppType == 1 )
        {   // assume that the support includes the topmost nVars of the manager
            assert( nVars );
            for ( v = 0; v < nVars; v++ )
                s_XVars[v] = Cudd_bddIthVar( dd, dd->invperm[v] );
        }
        else // determine the support
        {
            DdNode * SuppOn, * SuppOff, * Supp;
            int cVars = 0;
            DdNode * TempSupp;

            // determine support
            SuppOn = Cudd_Support( dd, OnSet );         Cudd_Ref( SuppOn );
            SuppOff = Cudd_Support( dd, OffSet );       Cudd_Ref( SuppOff );
            Supp = Cudd_bddAnd( dd, SuppOn, SuppOff );  Cudd_Ref( Supp );
            Cudd_RecursiveDeref( dd, SuppOn );
            Cudd_RecursiveDeref( dd, SuppOff );

            nVars = Cudd_SupportSize( dd, Supp );
            if ( nVars > MAXVARS )
            {
                fprintf( Output, "PrintKMap(): The number of variables is more than %d\n", MAXVARS );
                Cudd_RecursiveDeref( dd, Supp );
                return;
            }

            // assign variables
            for ( TempSupp = Supp; TempSupp != dd->one; TempSupp = Cudd_T(TempSupp), cVars++ )
                s_XVars[cVars] = Cudd_bddIthVar( dd, TempSupp->index );

            Cudd_RecursiveDeref( dd, TempSupp );
        }
    }
    else
    {
        // copy variables
        assert( XVars );
        for ( v = 0; v < nVars; v++ )
            s_XVars[v] = XVars[v];
    }

    ////////////////////////////////////////////////////////////////////
    // determine the Karnaugh map parameters
    nVarsVer = nVars/2;
    nVarsHor = nVars - nVarsVer;

    nCellsVer = (1<<nVarsVer);
    nCellsHor = (1<<nVarsHor);
    nSkipSpaces = nVarsVer + 1;

    ////////////////////////////////////////////////////////////////////
    // print variable names
    fprintf( Output, "\n" );
    for ( w = 0; w < nVarsVer; w++ )
        if ( pVarNames == NULL )
            fprintf( Output, "%c", 'a'+nVarsHor+w );
        else
            fprintf( Output, " %s", pVarNames[nVarsHor+w] );

    if ( fHorizontalVarNamesPrintedAbove )
    {
        fprintf( Output, " \\ " );
        for ( w = 0; w < nVarsHor; w++ )
            if ( pVarNames == NULL )
                fprintf( Output, "%c", 'a'+w );
            else
                fprintf( Output, "%s ", pVarNames[w] );
    }
    fprintf( Output, "\n" );

    if ( fHorizontalVarNamesPrintedAbove )
    {
        ////////////////////////////////////////////////////////////////////
        // print horizontal digits
        for ( d = 0; d < nVarsHor; d++ )
        {
            for ( p = 0; p < nSkipSpaces + 2; p++, fprintf( Output, " " ) );
            for ( n = 0; n < nCellsHor; n++ )
                if ( GrayCode(n) & (1<<(nVarsHor-1-d)) )
                    fprintf( Output, "1   " );
                else
                    fprintf( Output, "0   " );
            fprintf( Output, "\n" );
        }
    }

    ////////////////////////////////////////////////////////////////////
    // print the upper line
    for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
    fprintf( Output, "%c", DOUBLE_TOP_LEFT );
    for ( s = 0; s < nCellsHor; s++ )
    {
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        if ( s != nCellsHor-1 )
        {
            if ( s&1 )
                fprintf( Output, "%c", D_JOINS_D_HOR_BOT );
            else
                fprintf( Output, "%c", S_JOINS_D_HOR_BOT );
        }
    }
    fprintf( Output, "%c", DOUBLE_TOP_RIGHT );
    fprintf( Output, "\n" );

    ////////////////////////////////////////////////////////////////////
    // print the map
    for ( v = 0; v < nCellsVer; v++ )
    {
        DdNode * CubeVerBDD;

        // print horizontal digits
//      for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
        for ( n = 0; n < nVarsVer; n++ )
            if ( GrayCode(v) & (1<<(nVarsVer-1-n)) )
                fprintf( Output, "1" );
            else
                fprintf( Output, "0" );
        fprintf( Output, " " );

        // find vertical cube
        CubeVerBDD = Extra_bddBitsToCube( dd, GrayCode(v), nVarsVer, s_XVars+nVarsHor, 1 );    Cudd_Ref( CubeVerBDD );

        // print text line
        fprintf( Output, "%c", DOUBLE_VERTICAL );
        for ( h = 0; h < nCellsHor; h++ )
        {
            DdNode * CubeHorBDD, * Prod, * ValueOnSet, * ValueOffSet;

            fprintf( Output, " " );
//          fprintf( Output, "x" );
            ///////////////////////////////////////////////////////////////
            // determine what should be printed
            CubeHorBDD  = Extra_bddBitsToCube( dd, GrayCode(h), nVarsHor, s_XVars, 1 );    Cudd_Ref( CubeHorBDD );
            Prod = Cudd_bddAnd( dd, CubeHorBDD, CubeVerBDD );                   Cudd_Ref( Prod );
            Cudd_RecursiveDeref( dd, CubeHorBDD );

            ValueOnSet  = Cudd_Cofactor( dd, OnSet, Prod );                     Cudd_Ref( ValueOnSet );
            ValueOffSet = Cudd_Cofactor( dd, OffSet, Prod );                    Cudd_Ref( ValueOffSet );
            Cudd_RecursiveDeref( dd, Prod );

#ifdef WIN32
            {
            HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
            char Symb = 0, Color = 0;
            if ( ValueOnSet == b1 && ValueOffSet == b0 )
                Symb = SYMBOL_ONE,     Color = 14;  // yellow
            else if ( ValueOnSet == b0 && ValueOffSet == b1 )
                Symb = SYMBOL_ZERO,    Color = 11;  // blue
            else if ( ValueOnSet == b0 && ValueOffSet == b0 ) 
                Symb = SYMBOL_DC,      Color = 10;  // green
            else if ( ValueOnSet == b1 && ValueOffSet == b1 ) 
                Symb = SYMBOL_OVERLAP, Color = 12;  // red
            else
                assert(0);
            SetConsoleTextAttribute( hConsole, Color );
            fprintf( Output, "%c", Symb );
            SetConsoleTextAttribute( hConsole, 7 );
            }
#else
            {
            if ( ValueOnSet == b1 && ValueOffSet == b0 )
                fprintf( Output, "%c", SYMBOL_ONE );
            else if ( ValueOnSet == b0 && ValueOffSet == b1 )
                fprintf( Output, "%c", SYMBOL_ZERO );
            else if ( ValueOnSet == b0 && ValueOffSet == b0 ) 
                fprintf( Output, "%c", SYMBOL_DC );
            else if ( ValueOnSet == b1 && ValueOffSet == b1 ) 
                fprintf( Output, "%c", SYMBOL_OVERLAP );
            else
                assert(0);
            }
#endif

            Cudd_RecursiveDeref( dd, ValueOnSet );
            Cudd_RecursiveDeref( dd, ValueOffSet );
            ///////////////////////////////////////////////////////////////
            fprintf( Output, " " );

            if ( h != nCellsHor-1 )
            {
                if ( h&1 )
                    fprintf( Output, "%c", DOUBLE_VERTICAL );
                else
                    fprintf( Output, "%c", SINGLE_VERTICAL );
            }
        }
        fprintf( Output, "%c", DOUBLE_VERTICAL );
        fprintf( Output, "\n" );

        Cudd_RecursiveDeref( dd, CubeVerBDD );

        if ( v != nCellsVer-1 )
        // print separator line
        {
            for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
            if ( v&1 )
            {
                fprintf( Output, "%c", D_JOINS_D_VER_RIGHT );
                for ( s = 0; s < nCellsHor; s++ )
                {
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    if ( s != nCellsHor-1 )
                    {
                        if ( s&1 )
                            fprintf( Output, "%c", DOUBLES_CROSS );
                        else
                            fprintf( Output, "%c", S_VER_CROSS_D_HOR );
                    }
                }
                fprintf( Output, "%c", D_JOINS_D_VER_LEFT );
            }
            else
            {
                fprintf( Output, "%c", S_JOINS_D_VER_RIGHT );
                for ( s = 0; s < nCellsHor; s++ )
                {
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    if ( s != nCellsHor-1 )
                    {
                        if ( s&1 )
                            fprintf( Output, "%c", S_HOR_CROSS_D_VER );
                        else
                            fprintf( Output, "%c", SINGLES_CROSS );
                    }
                }
                fprintf( Output, "%c", S_JOINS_D_VER_LEFT );
            }
            fprintf( Output, "\n" );
        }
    }
    
    ////////////////////////////////////////////////////////////////////
    // print the lower line
    for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
    fprintf( Output, "%c", DOUBLE_BOT_LEFT );
    for ( s = 0; s < nCellsHor; s++ )
    {
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        if ( s != nCellsHor-1 )
        {
            if ( s&1 )
                fprintf( Output, "%c", D_JOINS_D_HOR_TOP );
            else
                fprintf( Output, "%c", S_JOINS_D_HOR_TOP );
        }
    }
    fprintf( Output, "%c", DOUBLE_BOT_RIGHT );
    fprintf( Output, "\n" );

    if ( !fHorizontalVarNamesPrintedAbove )
    {
        ////////////////////////////////////////////////////////////////////
        // print horizontal digits
        for ( d = 0; d < nVarsHor; d++ )
        {
            for ( p = 0; p < nSkipSpaces + 2; p++, fprintf( Output, " " ) );
            for ( n = 0; n < nCellsHor; n++ )
                if ( GrayCode(n) & (1<<(nVarsHor-1-d)) )
                    fprintf( Output, "1   " );
                else
                    fprintf( Output, "0   " );

            /////////////////////////////////
            fprintf( Output, "%c", (char)('a'+d) );
            /////////////////////////////////
            fprintf( Output, "\n" );
        }
    }
}